

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

FunctionBody * __thiscall
ByteCodeGenerator::EnsureFakeGlobalFuncForUndefer(ByteCodeGenerator *this,ParseNode *pnode)

{
  undefined1 *puVar1;
  FunctionBody *ptr;
  ParseNodeFnc *pPVar2;
  
  ptr = (((this->scriptContext->super_ScriptContextBase).javascriptLibrary)->
        fakeGlobalFuncForUndefer).ptr;
  if (ptr == (FunctionBody *)0x0) {
    ptr = MakeGlobalFunctionBody(this,pnode);
    Memory::WriteBarrierPtr<Js::FunctionBody>::WriteBarrierSet
              (&((this->scriptContext->super_ScriptContextBase).javascriptLibrary)->
                fakeGlobalFuncForUndefer,ptr);
  }
  pPVar2 = ParseNode::AsParseNodeFnc(pnode);
  if ((pPVar2->fncFlags & kFunctionStrictMode) != kFunctionNone) {
    puVar1 = &(ptr->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46;
    *puVar1 = *puVar1 | 1;
  }
  return ptr;
}

Assistant:

Js::FunctionBody *ByteCodeGenerator::EnsureFakeGlobalFuncForUndefer(ParseNode *pnode)
{
    Js::FunctionBody *func = scriptContext->GetLibrary()->GetFakeGlobalFuncForUndefer();
    if (!func)
    {
        func = this->MakeGlobalFunctionBody(pnode);
        scriptContext->GetLibrary()->SetFakeGlobalFuncForUndefer(func);
    }
    if (pnode->AsParseNodeFnc()->GetStrictMode() != 0)
    {
        func->SetIsStrictMode();
    }

    return func;
}